

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::FileClassPrefix_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  key_type *__k;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  undefined1 in_R9B;
  pointer input;
  StringPiece full;
  allocator local_f2;
  allocator local_f1;
  string error_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  segments;
  StringPiece local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  SimpleLineCollector collector;
  
  if ((*(byte *)(*(long *)(this + 0x78) + 0x28) & 8) == 0) {
    if (((anonymous_namespace)::g_prefix_mode == '\x01') &&
       (__k = *(key_type **)(this + 8), __k->_M_string_length != 0)) {
      if ((DAT_004e13b8 == 0) && (DAT_004e1388 != 0)) {
        error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
        error_str._M_string_length = 0;
        error_str.field_2._M_local_buf[0] = '\0';
        collector.super_LineConsumer._vptr_LineConsumer = (_func_int **)&PTR__LineConsumer_004d81c8;
        collector.set_ =
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&DAT_004e13a0;
        bVar1 = ParseSimpleFile((string *)&DAT_004e1380,&collector.super_LineConsumer,&error_str);
        if (!bVar1) {
          if (error_str._M_string_length == 0) {
            std::__cxx11::string::string
                      ((string *)&local_60,"protoc:0: warning: Failed to parse",&local_f1);
            std::__cxx11::string::string
                      ((string *)&local_80," package prefix exceptions file: ",&local_f2);
            std::operator+(&local_a0,&local_60,&local_80);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &segments,&local_a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &DAT_004e1380);
            std::__cxx11::string::operator=((string *)&error_str,(string *)&segments);
            std::__cxx11::string::~string((string *)&segments);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_60);
          }
          poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&error_str);
          std::endl<char,std::char_traits<char>>(poVar2);
          std::ostream::flush();
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&DAT_004e13a0);
        }
        if (DAT_004e13b8 == 0) {
          std::__cxx11::string::string
                    ((string *)&segments,"<not a real package>",(allocator *)&local_a0);
          std::__detail::
          _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)&DAT_004e13a0,(value_type *)&segments);
          std::__cxx11::string::~string((string *)&segments);
        }
        std::__cxx11::string::~string((string *)&error_str);
      }
      sVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&DAT_004e13a0,__k);
      if (sVar3 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                  (&local_b0,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8)
                  );
        full.length_ = (size_type)".";
        full.ptr_ = (char *)local_b0.length_;
        Split_abi_cxx11_(&segments,(protobuf *)local_b0.ptr_,full,(char *)0x1,(bool)in_R9B);
        for (input = segments.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            input != segments.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; input = input + 1) {
          anon_unknown_0::UnderscoresToCamelCase(&error_str,input,true);
          if (error_str._M_string_length != 0) {
            if (__return_storage_ptr__->_M_string_length != 0) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          std::__cxx11::string::~string((string *)&error_str);
        }
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&segments);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&error_str);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)(*(ulong *)(*(long *)(this + 0x78) + 0x60) & 0xfffffffffffffffe));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileClassPrefix(const FileDescriptor* file) {
  // Always honor the file option.
  if (file->options().has_objc_class_prefix()) {
    return file->options().objc_class_prefix();
  }

  // If package prefix isn't enabled or no package, done.
  if (!g_prefix_mode.use_package_name() || file->package().empty()) {
    return "";
  }

  // If the package is in the exceptions list, done.
  if (g_prefix_mode.is_package_exempted(file->package())) {
    return "";
  }

  // Transform the package into a prefix: use the dot segments as part,
  // camelcase each one and then join them with underscores, and add an
  // underscore at the end.
  std::string result;
  const std::vector<std::string> segments = Split(file->package(), ".", true);
  for (const auto& segment : segments) {
    const std::string part = UnderscoresToCamelCase(segment, true);
    if (part.empty()) {
      continue;
    }
    if (!result.empty()) {
      result.append("_");
    }
    result.append(part);
  }
  if (!result.empty()) {
    result.append("_");
  }
  return result;
}